

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_31::HttpClientAdapter::DelayedEofInputStream::tryRead
          (DelayedEofInputStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  ChainPromiseNode *pCVar2;
  ChainPromiseNode *extraout_RDX;
  ChainPromiseNode *extraout_RDX_00;
  Own<kj::_::ChainPromiseNode> OVar3;
  Promise<unsigned_long> PVar4;
  Own<kj::_::PromiseNode> local_58;
  Own<kj::_::PromiseNode> local_48;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  (**(code **)(**(long **)((long)buffer + 0x10) + 8))(&local_58);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_58,
             _::
             TransformPromiseNode<kj::Promise<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:4233:17),_kj::_::PropagateException>
             ::anon_class_16_2_dfc37374_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00445eb8;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)buffer;
  this_00[1].dependency.disposer = (Disposer *)maxBytes;
  local_48.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,unsigned_long,kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream::tryRead(void*,unsigned_long,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
        ::instance;
  local_48.ptr = (PromiseNode *)this_00;
  OVar3 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_38,&local_48);
  pPVar1 = local_48.ptr;
  pCVar2 = OVar3.ptr;
  *(undefined4 *)&(this->super_AsyncInputStream)._vptr_AsyncInputStream = local_38;
  *(undefined4 *)((long)&(this->super_AsyncInputStream)._vptr_AsyncInputStream + 4) = uStack_34;
  *(undefined4 *)&(this->inner).disposer = uStack_30;
  *(undefined4 *)((long)&(this->inner).disposer + 4) = uStack_2c;
  if ((TransformPromiseNodeBase *)local_48.ptr != (TransformPromiseNodeBase *)0x0) {
    local_48.ptr = (PromiseNode *)0x0;
    (**(local_48.disposer)->_vptr_Disposer)
              (local_48.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
    pCVar2 = extraout_RDX;
  }
  pPVar1 = local_58.ptr;
  if (local_58.ptr != (PromiseNode *)0x0) {
    local_58.ptr = (PromiseNode *)0x0;
    (**(local_58.disposer)->_vptr_Disposer)
              (local_58.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    pCVar2 = extraout_RDX_00;
  }
  PVar4.super_PromiseBase.node.ptr = &pCVar2->super_PromiseNode;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar4.super_PromiseBase.node;
}

Assistant:

kj::Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
      return inner->tryRead(buffer, minBytes, maxBytes)
          .then([this, minBytes](size_t amount) -> kj::Promise<size_t> {
        if (amount < minBytes) {
          // Must have reached EOF.
          KJ_IF_MAYBE(t, completionTask) {
            // Delay until completion.
            auto result = t->then([amount]() { return amount; });
            completionTask = nullptr;
            return result;
          } else {
            // Must have called tryRead() again after we already signaled EOF. Fine.
            return amount;
          }
        } else {
          return amount;
        }
      });
    }